

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O2

void * __thiscall RelocBlockWrapper::getPtr(RelocBlockWrapper *this)

{
  Executable *pEVar1;
  long lVar2;
  int iVar3;
  IMAGE_BASE_RELOCATION *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  long lVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar7;
  offset_t oVar8;
  
  if ((this->parentDir != (RelocDirWrapper *)0x0) &&
     (pIVar4 = RelocDirWrapper::reloc(this->parentDir), pIVar4 != (IMAGE_BASE_RELOCATION *)0x0)) {
    if (this->cachedRaw != 0xffffffffffffffff) {
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,this->cachedRaw,1,8,0);
      return (void *)CONCAT44(extraout_var,iVar3);
    }
    iVar3 = (*(this->parentDir->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x20])
                      (this->parentDir,(this->super_ExeNodeWrapper).entryNum - 1);
    if ((CONCAT44(extraout_var_00,iVar3) != 0) &&
       (plVar5 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar3),&ExeNodeWrapper::typeinfo,
                                        &typeinfo,0), plVar5 != (long *)0x0)) {
      lVar2 = plVar5[8];
      lVar6 = (**(code **)(*plVar5 + 0x60))(plVar5);
      if (lVar2 != -1) {
        oVar8 = lVar2 + (ulong)*(uint *)(lVar6 + 4);
        pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
        iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                          (pEVar1,oVar8,1,8,0);
        if ((void *)CONCAT44(extraout_var_01,iVar3) != (void *)0x0) {
          this->cachedRaw = oVar8;
          return (void *)CONCAT44(extraout_var_01,iVar3);
        }
      }
    }
    iVar3 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[6])(this,pIVar4,0);
    oVar8 = CONCAT44(extraout_var_02,iVar3);
    uVar7 = 0xffffffffffffffff;
    do {
      uVar7 = uVar7 + 1;
      if ((this->super_ExeNodeWrapper).entryNum <= uVar7) {
        this->cachedRaw = oVar8;
        return pIVar4;
      }
      oVar8 = oVar8 + pIVar4->SizeOfBlock;
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,oVar8,1,8,0);
      pIVar4 = (IMAGE_BASE_RELOCATION *)CONCAT44(extraout_var_03,iVar3);
    } while (pIVar4 != (IMAGE_BASE_RELOCATION *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void* RelocBlockWrapper::getPtr()
{
    if (this->parentDir == NULL) return NULL;
    IMAGE_BASE_RELOCATION* reloc = this->parentDir->reloc();
    if (!reloc) return NULL;

    offset_t raw = INVALID_ADDR;
    BYTE *ptr = NULL;

    // use my cached:
    if (this->cachedRaw != INVALID_ADDR) {
        ptr = m_Exe->getContentAt(this->cachedRaw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));
        return ptr;
    }

    // use previous cached to calculate my cached
    size_t prevNum = this->entryNum - 1;

    RelocBlockWrapper *prevEntry = dynamic_cast<RelocBlockWrapper*> (this->parentDir->getEntryAt(prevNum));
    if (prevEntry) {
        offset_t prevRaw = prevEntry->cachedRaw;

        IMAGE_BASE_RELOCATION* prevReloc = (IMAGE_BASE_RELOCATION*) prevEntry->getPtr();
        raw = prevRaw + prevReloc->SizeOfBlock;

        if (prevRaw != INVALID_ADDR) {
            ptr = m_Exe->getContentAt(raw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));

            if (ptr != NULL) {
                this->cachedRaw = raw;
                return ptr;
            }
        }
    }
    // previous cached not avaliable, calculate...
    offset_t firstRaw = this->getOffset(reloc);
    offset_t blockSize = reloc->SizeOfBlock;

    raw = firstRaw;
    ptr = (BYTE*) reloc;

    for ( size_t i = 0; i < this->entryNum; i++) { //TODO: make caching
        raw += blockSize;

        ptr = m_Exe->getContentAt(raw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));
        if (!ptr) return NULL;

        reloc = (IMAGE_BASE_RELOCATION*) ptr;
        blockSize = reloc->SizeOfBlock;
    }

    this->cachedRaw = raw;
    return ptr;
}